

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * QString::fromUcs4(QString *__return_storage_ptr__,char32_t *unicode,qsizetype size)

{
  long in_FS_OFFSET;
  undefined8 *local_70;
  long local_68;
  char32_t *local_60;
  undefined8 local_58;
  State local_50;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (unicode == (char32_t *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
  }
  else {
    if (size < 0) {
      size = wcslen(unicode);
    }
    local_58 = 0x666aa0;
    local_50.flags.super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
    super_QFlagsStorage<QStringConverterBase::Flag>.i =
         (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)
         (QFlagsStorage<QStringConverterBase::Flag>)0x1;
    local_50._4_8_ = 0;
    local_50._12_8_ = 0;
    local_50._20_8_ = 0;
    local_50.field_4.state_data[1] = 0;
    local_50.field_4.state_data[2] = 0;
    local_50.field_4.state_data[3] = 0;
    local_50.clearFn = (ClearDataFn)0x0;
    local_68 = size << 2;
    local_70 = &local_58;
    local_60 = unicode;
    QStringDecoder::EncodedData::operator_cast_to_QString
              (__return_storage_ptr__,(EncodedData *)&local_70);
    QStringConverterBase::State::clear(&local_50);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QString QString::fromUcs4(const char32_t *unicode, qsizetype size)
{
    if (!unicode)
        return QString();
    if (size < 0) {
        if constexpr (sizeof(char32_t) == sizeof(wchar_t))
            size = wcslen(reinterpret_cast<const wchar_t *>(unicode));
        else
            size = std::char_traits<char32_t>::length(unicode);
    }
    QStringDecoder toUtf16(QStringDecoder::Utf32, QStringDecoder::Flag::Stateless);
    return toUtf16(QByteArrayView(reinterpret_cast<const char *>(unicode), size * 4));
}